

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O2

int password_verify(char *password,char *hash)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sStack_60;
  char output [61];
  
  if (password == (char *)0x0) {
    if (msgno < 0) {
      return -1;
    }
    pcVar2 = "password_verify: missing password\n";
    sStack_60 = 0x22;
  }
  else {
    if (hash == (char *)0x0) {
      if (msgno < 0) {
        return -1;
      }
      pcVar2 = "password_verify: missing hash\n";
    }
    else {
      if (0 < msgno) {
        fprintf(_stderr,"password_verify: parameters\n  password => %s\n  hash     => %s\n",password
                ,hash);
      }
      output[0x30] = '\0';
      output[0x31] = '\0';
      output[0x32] = '\0';
      output[0x33] = '\0';
      output[0x34] = '\0';
      output[0x35] = '\0';
      output[0x36] = '\0';
      output[0x37] = '\0';
      output[0x38] = '\0';
      output[0x39] = '\0';
      output[0x3a] = '\0';
      output[0x3b] = '\0';
      output[0x3c] = '\0';
      output[0x20] = '\0';
      output[0x21] = '\0';
      output[0x22] = '\0';
      output[0x23] = '\0';
      output[0x24] = '\0';
      output[0x25] = '\0';
      output[0x26] = '\0';
      output[0x27] = '\0';
      output[0x28] = '\0';
      output[0x29] = '\0';
      output[0x2a] = '\0';
      output[0x2b] = '\0';
      output[0x2c] = '\0';
      output[0x2d] = '\0';
      output[0x2e] = '\0';
      output[0x2f] = '\0';
      output[0x10] = '\0';
      output[0x11] = '\0';
      output[0x12] = '\0';
      output[0x13] = '\0';
      output[0x14] = '\0';
      output[0x15] = '\0';
      output[0x16] = '\0';
      output[0x17] = '\0';
      output[0x18] = '\0';
      output[0x19] = '\0';
      output[0x1a] = '\0';
      output[0x1b] = '\0';
      output[0x1c] = '\0';
      output[0x1d] = '\0';
      output[0x1e] = '\0';
      output[0x1f] = '\0';
      output[0] = '\0';
      output[1] = '\0';
      output[2] = '\0';
      output[3] = '\0';
      output[4] = '\0';
      output[5] = '\0';
      output[6] = '\0';
      output[7] = '\0';
      output[8] = '\0';
      output[9] = '\0';
      output[10] = '\0';
      output[0xb] = '\0';
      output[0xc] = '\0';
      output[0xd] = '\0';
      output[0xe] = '\0';
      output[0xf] = '\0';
      pcVar2 = _crypt_blowfish_rn(password,hash,output,0x3d);
      if (pcVar2 == (char *)0x0) {
        if (msgno < 1) {
          return -1;
        }
        pcVar2 = "password_verify: blowfish run.\n";
        sStack_60 = 0x1f;
        goto LAB_00101b71;
      }
      sVar3 = strlen(output);
      sVar4 = strlen(hash);
      if ((0xd < sVar3) && (sVar3 == sVar4)) {
        bVar1 = 0;
        for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
          bVar1 = bVar1 | hash[sVar4] ^ output[sVar4];
        }
        return -(uint)(bVar1 != 0);
      }
      if (msgno < 1) {
        return -1;
      }
      pcVar2 = "password_verify: hash length.\n";
    }
    sStack_60 = 0x1e;
  }
LAB_00101b71:
  fwrite(pcVar2,sStack_60,1,_stderr);
  return -1;
}

Assistant:

int
password_verify(const char *password, const char *hash)
{
    char output[BLOWFISH_LEN+1];
    size_t i, len;
    int status = 0;

    if (!password) {
        msg_error(verify, "missing password\n");
        return -1;
    }
    if (!hash) {
        msg_error(verify, "missing hash\n");
        return -1;
    }

    msg_verbose(verify, "parameters\n"
                "  password => %s\n"
                "  hash     => %s\n",
                password, hash);

    memset(output, 0, sizeof(output));

    if (_crypt_blowfish_rn(password, hash, output, sizeof(output)) == NULL) {
        msg_verbose(verify, "blowfish run.\n");
        return -1;
    }

    len = strlen(output);
    if (len != strlen(hash) || len <= 13) {
        msg_verbose(verify, "hash length.\n");
        return -1;
    }

    for (i = 0; i < len; i++) {
        status |= (output[i] ^ hash[i]);
    }

    if (status != 0) {
        return -1;
    }

    return 0;
}